

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void tx_partition_count_update
               (AV1_COMMON *cm,MACROBLOCK *x,BLOCK_SIZE plane_bsize,FRAME_COUNTS *td_counts,
               uint8_t allow_update_cdf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  int depth;
  int idx;
  int blk_row;
  int iVar6;
  
  uVar5 = CONCAT71(in_register_00000011,plane_bsize) & 0xffffffff;
  depth = 0;
  uVar4 = 0;
  if ((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] == 0) {
    uVar4 = (uint)""[uVar5];
  }
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar5];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar5];
  iVar6 = *(int *)((long)tx_size_high_unit + (ulong)(uVar4 << 2));
  iVar3 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar4 << 2));
  (x->e_mbd).above_txfm_context =
       (cm->above_contexts).txfm[(x->e_mbd).tile.tile_row] + (x->e_mbd).mi_col;
  (x->e_mbd).left_txfm_context = (x->e_mbd).left_txfm_context_buffer + ((x->e_mbd).mi_row & 0x1f);
  do {
    blk_row = 0;
    do {
      update_txfm_count(x,&x->e_mbd,(FRAME_COUNTS *)(ulong)uVar4,'\0',depth,blk_row,
                        (uint)td_counts & 0xff,(uint8_t)iVar6);
      blk_row = blk_row + iVar3;
    } while (blk_row < (int)(uint)bVar1);
    depth = depth + iVar6;
  } while (depth < (int)(uint)bVar2);
  return;
}

Assistant:

static void tx_partition_count_update(const AV1_COMMON *const cm, MACROBLOCK *x,
                                      BLOCK_SIZE plane_bsize,
                                      FRAME_COUNTS *td_counts,
                                      uint8_t allow_update_cdf) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int mi_width = mi_size_wide[plane_bsize];
  const int mi_height = mi_size_high[plane_bsize];
  const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, 0);
  const int bh = tx_size_high_unit[max_tx_size];
  const int bw = tx_size_wide_unit[max_tx_size];

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  for (int idy = 0; idy < mi_height; idy += bh) {
    for (int idx = 0; idx < mi_width; idx += bw) {
      update_txfm_count(x, xd, td_counts, max_tx_size, 0, idy, idx,
                        allow_update_cdf);
    }
  }
}